

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_add_http2_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  int local_44;
  int len;
  uchar *end_local;
  uchar **p_local;
  int length_local;
  uchar *value_local;
  uchar *name_local;
  lws *wsi_local;
  
  _lws_log(0x40,"%s: %p  %s:%s (len %d)\n","lws_add_http2_header_by_name",*p,name,value,length);
  sVar3 = strlen((char *)name);
  local_44 = (int)sVar3;
  if ((local_44 != 0) && (name[local_44 + -1] == ':')) {
    local_44 = local_44 + -1;
  }
  if (((*(ulong *)&wsi->field_0x2dc >> 1 & 1) == 0) ||
     (iVar2 = strncmp((char *)name,"transfer-encoding",(long)local_44), iVar2 != 0)) {
    if ((long)end - (long)*p < (long)(local_44 + length + 8)) {
      wsi_local._4_4_ = 1;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = '\0';
      iVar2 = lws_h2_num_start(7,(long)local_44);
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = (uchar)iVar2;
      iVar2 = lws_h2_num(7,(long)local_44,p,end);
      value_local = name;
      if (iVar2 == 0) {
        while (local_44 != 0) {
          iVar2 = tolower((uint)*value_local);
          puVar1 = *p;
          *p = puVar1 + 1;
          *puVar1 = (uchar)iVar2;
          local_44 = local_44 + -1;
          value_local = value_local + 1;
        }
        iVar2 = lws_h2_num_start(7,(long)length);
        puVar1 = *p;
        *p = puVar1 + 1;
        *puVar1 = (uchar)iVar2;
        iVar2 = lws_h2_num(7,(long)length,p,end);
        if (iVar2 == 0) {
          memcpy(*p,value,(long)length);
          *p = *p + length;
          wsi_local._4_4_ = 0;
        }
        else {
          wsi_local._4_4_ = 1;
        }
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
  }
  else {
    _lws_log(0x40,"rejecting %s\n",name);
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_add_http2_header_by_name(struct lws *wsi, const unsigned char *name,
				 const unsigned char *value, int length,
				 unsigned char **p, unsigned char *end)
{
	int len;

	lwsl_header("%s: %p  %s:%s (len %d)\n", __func__, *p, name, value,
					length);

	len = (int)strlen((char *)name);
	if (len)
		if (name[len - 1] == ':')
			len--;

	if (wsi->mux_substream && !strncmp((const char *)name,
					     "transfer-encoding", len)) {
		lwsl_header("rejecting %s\n", name);

		return 0;
	}

	if (end - *p < len + length + 8)
		return 1;

	*((*p)++) = 0; /* literal hdr, literal name,  */

	*((*p)++) = 0 | lws_h2_num_start(7, len); /* non-HUF */
	if (lws_h2_num(7, len, p, end))
		return 1;

	/* upper-case header names are verboten in h2, but OK on h1, so
	 * they're not illegal per se.  Silently convert them for h2... */

	while(len--)
		*((*p)++) = tolower((int)*name++);

	*((*p)++) = 0 | lws_h2_num_start(7, length); /* non-HUF */
	if (lws_h2_num(7, length, p, end))
		return 1;

	memcpy(*p, value, length);
	*p += length;

	return 0;
}